

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

Location * __thiscall
trieste::REIterator::current(Location *__return_storage_ptr__,REIterator *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  const_pointer pcVar2;
  pointer pcVar3;
  element_type *peVar4;
  
  peVar1 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pcVar2 = (this->sp).data_;
    pcVar3 = (peVar1->contents)._M_dataplus._M_p;
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->pos = (long)pcVar2 - (long)pcVar3;
    __return_storage_ptr__->len = 1;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      peVar4 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      peVar4 = peVar1;
    }
    pcVar2 = (this->sp).data_;
    pcVar3 = (peVar4->contents)._M_dataplus._M_p;
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    __return_storage_ptr__->pos = (long)pcVar2 - (long)pcVar3;
    __return_storage_ptr__->len = 1;
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Location current() const
    {
      return {
        source, static_cast<size_t>(sp.data() - source->view().data()), 1};
    }